

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O0

void __thiscall
Adjacency_Subgraph_vertex_level_Test::TestBody(Adjacency_Subgraph_vertex_level_Test *this)

{
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  element_type *peVar5;
  reference pvVar6;
  char *regex;
  AssertHelper local_510;
  Message local_508;
  int local_4fc;
  exception *gtest_exception;
  ReturnSentinel local_4c8;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_4a0;
  DeathTest *gtest_dt;
  Message local_490;
  int local_484;
  size_t local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_13;
  Message local_460;
  int local_454;
  size_t local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_12;
  Message local_430;
  int local_424;
  size_t local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_11;
  Message local_400;
  int local_3f4;
  size_t local_3f0;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_10;
  Message local_3d0;
  int local_3c4;
  size_t local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_9;
  Message local_3a0;
  int local_394;
  size_t local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_8;
  Message local_370;
  int local_364;
  size_t local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  int local_334;
  size_t local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_6;
  Message local_310;
  int local_304;
  size_t local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_5;
  allocator<unsigned_long> local_2d1;
  unsigned_long local_2d0;
  iterator local_2c8;
  size_type local_2c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2b8;
  Adjacency_Subgraph local_2a0;
  undefined1 local_238 [8];
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> i_global_local;
  Message local_220;
  int local_214;
  size_t local_210;
  size_t local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_4;
  Message local_1e8;
  int local_1dc;
  size_t local_1d8;
  size_t local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_3;
  Message local_1b0;
  int local_1a4;
  size_t local_1a0;
  size_t local_198;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_2;
  Message local_178;
  int local_16c;
  size_t local_168;
  size_t local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140;
  int local_134;
  size_t local_130;
  size_t local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  allocator<unsigned_long> local_f9;
  unsigned_long local_f8 [5];
  iterator local_d0;
  size_type local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  undefined1 local_a8 [8];
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  Adjacency_Subgraph_vertex_level_Test *this_local;
  
  Disa::create_graph_structured<false>
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,3);
  local_f8[2] = 4;
  local_f8[3] = 5;
  local_f8[0] = 1;
  local_f8[1] = 3;
  local_f8[4] = 7;
  local_d0 = local_f8;
  local_c8 = 5;
  std::allocator<unsigned_long>::allocator(&local_f9);
  __l_00._M_len = local_c8;
  __l_00._M_array = local_d0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_c0,__l_00,&local_f9);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_c0,0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_c0);
  std::allocator<unsigned_long>::~allocator(&local_f9);
  local_130 = 0;
  local_128 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_130);
  local_134 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_120,"subgraph.vertex_level(0)","0",&local_128,&local_134);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_168 = 1;
  local_160 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_168);
  local_16c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_158,"subgraph.vertex_level(1)","0",&local_160,&local_16c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_1a0 = 2;
  local_198 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_1a0);
  local_1a4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_190,"subgraph.vertex_level(2)","0",&local_198,&local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1d8 = 3;
  local_1d0 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_1d8);
  local_1dc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1c8,"subgraph.vertex_level(3)","0",&local_1d0,&local_1dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_210 = 4;
  local_208 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,&local_210);
  local_214 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_200,"subgraph.vertex_level(4)","0",&local_208,&local_214);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &i_global_local.
                super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x22e,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &i_global_local.
                super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_220);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &i_global_local.
                super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
  local_2d0 = 4;
  local_2c8 = &local_2d0;
  local_2c0 = 1;
  std::allocator<unsigned_long>::allocator(&local_2d1);
  __l._M_len = local_2c0;
  __l._M_array = local_2c8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_2b8,__l,&local_2d1);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_2a0,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_2b8,0);
  Disa::Adjacency_Subgraph::operator=((Adjacency_Subgraph *)local_a8,&local_2a0);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_2a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2b8);
  std::allocator<unsigned_long>::~allocator(&local_2d1);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_5.message_,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_238);
  Disa::Adjacency_Subgraph::update_levels
            ((Adjacency_Subgraph *)local_a8,
             (Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2,
             (shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_5.message_);
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &gtest_ar_5.message_);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,0);
  local_300 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_304 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2f8,"subgraph.vertex_level((*i_global_local)[0])","2",&local_300,
             &local_304);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x234,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,1);
  local_330 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_334 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_328,"subgraph.vertex_level((*i_global_local)[1])","1",&local_330,
             &local_334);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x235,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,2);
  local_360 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_364 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_358,"subgraph.vertex_level((*i_global_local)[2])","2",&local_360,
             &local_364);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x236,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,3);
  local_390 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_394 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_388,"subgraph.vertex_level((*i_global_local)[3])","1",&local_390,
             &local_394);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x237,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,4);
  local_3c0 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_3c4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b8,"subgraph.vertex_level((*i_global_local)[4])","0",&local_3c0,
             &local_3c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x238,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,5);
  local_3f0 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_3f4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3e8,"subgraph.vertex_level((*i_global_local)[5])","1",&local_3f0,
             &local_3f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x239,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_400);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,6);
  local_420 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_424 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_418,"subgraph.vertex_level((*i_global_local)[6])","2",&local_420,
             &local_424);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,7);
  local_450 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_454 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_448,"subgraph.vertex_level((*i_global_local)[7])","1",&local_450,
             &local_454);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  peVar5 = std::
           __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_238);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar5,8);
  local_480 = Disa::Adjacency_Subgraph::vertex_level((Adjacency_Subgraph *)local_a8,pvVar6);
  local_484 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_478,"subgraph.vertex_level((*i_global_local)[8])","2",&local_480,
             &local_484);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_490);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x23c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("subgraph.vertex_level(10) == 0",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x23d,&local_4a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_4a0 == (pointer)0x0) goto LAB_00132464;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_4a0);
      iVar2 = (*local_4a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_4a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_4a0->_vptr_DeathTest[4])(local_4a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00132375;
        local_4fc = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_4c8,local_4a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            gtest_exception = (exception *)0xa;
            Disa::Adjacency_Subgraph::vertex_level
                      ((Adjacency_Subgraph *)local_a8,(size_t *)&gtest_exception);
          }
          (*local_4a0->_vptr_DeathTest[5])(local_4a0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_4c8);
        }
LAB_00132375:
        local_4fc = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_4fc == 0) goto LAB_00132464;
    }
  }
  testing::Message::Message(&local_508);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_510,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
             ,0x23d,pcVar4);
  testing::internal::AssertHelper::operator=(&local_510,&local_508);
  testing::internal::AssertHelper::~AssertHelper(&local_510);
  testing::Message::~Message(&local_508);
LAB_00132464:
  std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~shared_ptr
            ((shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)local_238);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_a8);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph
            ((Adjacency_Graph<false> *)
             &subgraph.level_set_value.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, vertex_level) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);

  // Test local_global on primary subgraph.
  Adjacency_Subgraph subgraph(graph, {1, 3, 4, 5, 7});
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.vertex_level(1), 0);
  EXPECT_EQ(subgraph.vertex_level(2), 0);
  EXPECT_EQ(subgraph.vertex_level(3), 0);
  EXPECT_EQ(subgraph.vertex_level(4), 0);

  // Test local_global on both level and primary parts of the subgraph.
  std::shared_ptr<std::vector<std::size_t>> i_global_local = std::make_shared<std::vector<std::size_t>>();
  subgraph = Adjacency_Subgraph(graph, {4});
  subgraph.update_levels(graph, 2, i_global_local);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[0]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[1]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[2]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[3]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[4]), 0);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[5]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[6]), 2);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[7]), 1);
  EXPECT_EQ(subgraph.vertex_level((*i_global_local)[8]), 2);
  EXPECT_DEATH(subgraph.vertex_level(10) == 0, "./*");
}